

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

void IO_ENTRYINFO(EventEnum entryid)

{
  char *pcVar1;
  void *from;
  bool bVar2;
  uint32 x;
  int iVar3;
  HashMap_stackframe *pHVar4;
  undefined8 *__ptr;
  char *pcVar5;
  char *pcVar6;
  pthread_t x_00;
  ulong uVar7;
  char *pcVar8;
  uint x_01;
  ulong uVar9;
  void *callstack [34];
  void *new_strings_ptrs [32];
  char *new_strings [32];
  undefined1 local_348 [16];
  uint64 auStack_338 [32];
  uint64 auStack_238 [32];
  undefined8 auStack_138 [33];
  
  x = now();
  iVar3 = backtrace(local_348);
  uVar7 = 0;
  x_01 = 0;
  if (2 < iVar3) {
    uVar7 = 0;
    x_01 = 0;
    do {
      from = (void *)auStack_338[uVar7];
      pHVar4 = get_hashitem_stackframe(from,(uint8 *)0x0);
      pcVar8 = (char *)0x0;
      if (pHVar4 != (HashMap_stackframe *)0x0) {
        pcVar8 = pHVar4->to;
      }
      pcVar6 = pcVar8;
      if (pcVar8 == (char *)0x0) {
        __ptr = (undefined8 *)backtrace_symbols();
        pcVar6 = (char *)*__ptr;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)0x0;
        }
        else {
          pcVar5 = pcVar6;
          if (*pcVar6 == '0') {
            do {
              pcVar6 = pcVar5 + 1;
              pcVar1 = pcVar5 + 1;
              pcVar5 = pcVar6;
            } while (*pcVar1 == ' ');
          }
        }
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)0x0;
        }
        else {
          pcVar6 = strdup(pcVar6);
        }
        free(__ptr);
        if (pcVar6 != (char *)0x0) {
          add_stackframe_to_map(from,pcVar6);
        }
      }
      bVar2 = pcVar8 != (char *)0x0 || pcVar6 != (char *)0x0;
      if ((pcVar8 == (char *)0x0) && (pcVar6 != (char *)0x0)) {
        auStack_138[(int)x_01] = pcVar6;
        auStack_238[(int)x_01] = (uint64)from;
        x_01 = x_01 + 1;
        bVar2 = true;
      }
      if (!bVar2) goto LAB_0010400e;
      uVar7 = uVar7 + 1;
    } while (uVar7 != iVar3 - 2U);
    uVar7 = (ulong)(iVar3 - 2U);
  }
LAB_0010400e:
  if (0 < (int)x_01) {
    writele32(3);
    writele32(x_01);
    uVar9 = 0;
    do {
      IO_UINT64(auStack_238[uVar9]);
      IO_STRING((char *)auStack_138[uVar9]);
      uVar9 = uVar9 + 1;
    } while (x_01 != uVar9);
  }
  writele32(entryid);
  writele32(x);
  x_00 = pthread_self();
  IO_UINT64(x_00);
  writele32((uint32)uVar7);
  if ((uint32)uVar7 != 0) {
    uVar9 = 0;
    do {
      IO_UINT64(auStack_338[uVar9]);
      uVar9 = uVar9 + 1;
    } while ((uVar7 & 0xffffffff) != uVar9);
  }
  return;
}

Assistant:

__attribute__((noinline)) static void IO_ENTRYINFO(const EventEnum entryid)
{
    const uint32 currentms = now();
    void* callstack[MAX_CALLSTACKS + 2];
    char *new_strings[MAX_CALLSTACKS];
    void *new_strings_ptrs[MAX_CALLSTACKS];
    int frames = backtrace(callstack, MAX_CALLSTACKS);
    int num_new_strings = 0;
    int i;

    frames -= 2;  // skip IO_ENTRYINFO and entry point.
    if (frames < 0) {
        frames = 0;
    }

    for (i = 0; i < frames; i++) {
        int seen_before = 0;
        void *ptr = callstack[i + 2];
        char *str = get_callstack_sym(ptr, &seen_before);
        if ((str == NULL) && !seen_before) {
            break;
        }

        if (!seen_before) {
            new_strings[num_new_strings] = str;
            new_strings_ptrs[num_new_strings] = ptr;
            num_new_strings++;
        }
    }
    frames = i;  /* in case we stopped early. */

    if (num_new_strings > 0) {
        IO_EVENTENUM(ALEE_NEW_CALLSTACK_SYMS);
        IO_UINT32((uint32) num_new_strings);
        for (i = 0; i < num_new_strings; i++) {
            IO_PTR(new_strings_ptrs[i]);
            IO_STRING(new_strings[i]);
        }
    }

    IO_EVENTENUM(entryid);
    IO_UINT32(currentms);
    IO_UINT64((uint64) pthread_self());

    IO_UINT32((uint32) frames);
    for (i = 0; i < frames; i++) {
        IO_PTR(callstack[i + 2]);
    }
}